

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O1

void ** adt_hash_iter_next(adt_hash_t *self,char **ppKey)

{
  byte bVar1;
  char cVar2;
  adt_hkey_t *paVar3;
  adt_hnode_t *paVar4;
  adt_hmatch_t *paVar5;
  long *pVal;
  undefined8 *__ptr;
  void **ppvVar6;
  
  if (ppKey == (char **)0x0 || self == (adt_hash_t *)0x0) {
    return (void **)0x0;
  }
  if ((self->iter).pHkey == (adt_hkey_t *)0x0) {
LAB_0010601f:
    paVar4 = (self->iter).pNode;
    if (paVar4->u8Width == '\x10') goto code_r0x0010602a;
    bVar1 = (self->iter).u8Cur;
    if (paVar4->u8Cur <= bVar1) goto LAB_001060a2;
    paVar5 = (paVar4->child).match;
    (self->iter).u8Cur = bVar1 + 1;
    (self->iter).pHkey = paVar5[bVar1].key;
  }
LAB_00105fe6:
  paVar3 = (self->iter).pHkey;
  if (paVar3 == (adt_hkey_t *)0x0) {
    *ppKey = (char *)0x0;
    ppvVar6 = (void **)0x0;
  }
  else {
    *ppKey = paVar3->key;
    paVar3 = (self->iter).pHkey;
    ppvVar6 = &paVar3->val;
    (self->iter).pHkey = paVar3->next;
  }
  return ppvVar6;
code_r0x0010602a:
  bVar1 = (self->iter).u8Cur;
  while (bVar1 < 0x10) {
    paVar5 = (paVar4->child).match;
    (self->iter).u8Cur = bVar1 + 1;
    cVar2 = *(char *)((long)&paVar5[bVar1].u32Hash + 1);
    if (cVar2 != '\0') {
      pVal = (long *)malloc(0x10);
      if (pVal == (long *)0x0) {
        pVal = (long *)0x0;
      }
      else {
        *pVal = (long)paVar4;
        *(byte *)(pVal + 1) = bVar1 + 1;
      }
      adt_stack_push(&self->iter_stack,pVal);
      (self->iter).pNode = (adt_hnode_t *)(paVar5 + bVar1);
      (self->iter).u8Cur = '\0';
      if (cVar2 != '\0') goto LAB_0010601f;
    }
    bVar1 = (self->iter).u8Cur;
  }
  if (bVar1 != 0x10) goto LAB_00105fe6;
LAB_001060a2:
  __ptr = (undefined8 *)adt_stack_pop(&self->iter_stack);
  if (__ptr == (undefined8 *)0x0) goto LAB_00105fe6;
  (self->iter).pNode = (adt_hnode_t *)*__ptr;
  (self->iter).u8Cur = *(uint8_t *)(__ptr + 1);
  free(__ptr);
  goto LAB_0010601f;
}

Assistant:

void** adt_hash_iter_next(adt_hash_t *self,const char **ppKey){
	if(!self || !ppKey ) return (void*) 0;

	if(self->iter.pHkey == 0){
		//find next hkey
		adt_hnode_t *pNode;
BEGIN:
		pNode =  self->iter.pNode;
		if(pNode->u8Width == 16){
			while(self->iter.u8Cur<16){
				adt_hnode_t *pChild = &pNode->child.node[self->iter.u8Cur++];
				if(pChild->u8Cur>0){
					adt_stack_push(&self->iter_stack,adt_hit_stored_new(pNode,self->iter.u8Cur));
					self->iter.pNode = pChild;
					self->iter.u8Cur = 0;
					goto BEGIN;
				}
			}
			if(self->iter.u8Cur==16){
				//check stack
				adt_hit_stored_t *pStored = (adt_hit_stored_t*) adt_stack_pop(&self->iter_stack);
				if(pStored){
					//restore self->iter.Pnode and continue
					self->iter.pNode = pStored->pNode;
					self->iter.u8Cur = pStored->u8Cur;
					adt_hit_stored_delete(pStored);
					goto BEGIN;
				}
			}
		}
		else{
			if(self->iter.u8Cur >= pNode->u8Cur){
				adt_hit_stored_t *pStored = (adt_hit_stored_t*) adt_stack_pop(&self->iter_stack);
				if(pStored){
					//restore self->iter.Pnode and continue
					self->iter.pNode = pStored->pNode;
					self->iter.u8Cur = pStored->u8Cur;
					adt_hit_stored_delete(pStored);
					goto BEGIN;
				}
			}
			else{
				self->iter.pHkey = pNode->child.match[self->iter.u8Cur++].key;
			}
		}
	}

	if(self->iter.pHkey){
      void **ppVal;
      *ppKey = self->iter.pHkey->key;
		ppVal = &self->iter.pHkey->val;
		self->iter.pHkey = self->iter.pHkey->next;
		return ppVal;
	}
	else{
		*ppKey=0;
		return (void**) 0; //done
	}
}